

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Extractor * __thiscall ncnn::Extractor::operator=(Extractor *this,Extractor *rhs)

{
  Extractor *in_RSI;
  Extractor *in_RDI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000078;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000080;
  
  if (in_RDI != in_RSI) {
    in_RDI->d->net = in_RSI->d->net;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (in_stack_00000080,in_stack_00000078);
    memcpy(&in_RDI->d->opt,&in_RSI->d->opt,0x40);
  }
  return in_RDI;
}

Assistant:

Extractor& Extractor::operator=(const Extractor& rhs)
{
    if (this == &rhs)
        return *this;

    d->net = rhs.d->net;
    d->blob_mats = rhs.d->blob_mats;
    d->opt = rhs.d->opt;

#if NCNN_VULKAN
    d->local_blob_vkallocator = 0;
    d->local_staging_vkallocator = 0;

    d->blob_mats_gpu = rhs.d->blob_mats_gpu;
    d->blob_mats_gpu_image = rhs.d->blob_mats_gpu_image;
#endif // NCNN_VULKAN

    return *this;
}